

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_streambuf.cpp
# Opt level: O3

void __thiscall seekable::~seekable(seekable *this)

{
  pointer pcVar1;
  
  (this->super_io_device)._vptr_io_device = (_func_int **)&PTR_read_00109d00;
  pcVar1 = (this->dev).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 == (pointer)0x0) {
    return;
  }
  operator_delete(pcVar1);
  return;
}

Assistant:

size_t read(char *p,size_t n)
	{
		if(n + pos > dev.size()) {
			if(pos > dev.size())
				n=0;
			else
				n=dev.size() - pos;
		}
		if(n>0)
			memcpy(p,&dev[pos],n);
		pos+=n;
		return n;
	}